

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int reparse_path_expr(ly_ctx *ctx,lyxp_expr *exp,uint16_t *exp_idx)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  ly_ctx *ctx_local;
  
  iVar1 = exp_check_token(ctx,exp,*exp_idx,LYXP_TOKEN_NONE,1);
  if (iVar1 != 0) {
    return -1;
  }
  switch(exp->tokens[*exp_idx]) {
  case LYXP_TOKEN_PAR1:
    *exp_idx = *exp_idx + 1;
    iVar1 = reparse_or_expr(ctx,exp,exp_idx);
    if (iVar1 != 0) {
      return -1;
    }
    iVar1 = exp_check_token(ctx,exp,*exp_idx,LYXP_TOKEN_PAR2,1);
    if (iVar1 != 0) {
      return -1;
    }
    *exp_idx = *exp_idx + 1;
    break;
  default:
    pcVar2 = print_token(exp->tokens[*exp_idx]);
    ly_vlog(ctx,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar2,exp->expr + exp->expr_pos[*exp_idx])
    ;
    return -1;
  case LYXP_TOKEN_DOT:
  case LYXP_TOKEN_DDOT:
  case LYXP_TOKEN_AT:
  case LYXP_TOKEN_NAMETEST:
  case LYXP_TOKEN_NODETYPE:
    iVar1 = reparse_relative_location_path(ctx,exp,exp_idx);
    if (iVar1 == 0) {
      return 0;
    }
    return -1;
  case LYXP_TOKEN_FUNCNAME:
    iVar1 = reparse_function_call(ctx,exp,exp_idx);
    if (iVar1 != 0) {
      return -1;
    }
    break;
  case LYXP_TOKEN_OPERATOR_PATH:
    iVar1 = reparse_absolute_location_path(ctx,exp,exp_idx);
    if (iVar1 == 0) {
      return 0;
    }
    return -1;
  case LYXP_TOKEN_LITERAL:
    *exp_idx = *exp_idx + 1;
    break;
  case LYXP_TOKEN_NUMBER:
    *exp_idx = *exp_idx + 1;
  }
  while( true ) {
    bVar3 = false;
    if (*exp_idx < exp->used) {
      bVar3 = exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1;
    }
    if (!bVar3) break;
    iVar1 = reparse_predicate(ctx,exp,exp_idx);
    if (iVar1 != 0) {
      return -1;
    }
  }
  if ((*exp_idx < exp->used) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH)) {
    *exp_idx = *exp_idx + 1;
    iVar1 = reparse_relative_location_path(ctx,exp,exp_idx);
    if (iVar1 != 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

static int
reparse_path_expr(struct ly_ctx *ctx, struct lyxp_expr *exp, uint16_t *exp_idx)
{
    if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
        return -1;
    }

    switch (exp->tokens[*exp_idx]) {
    case LYXP_TOKEN_PAR1:
        /* '(' Expr ')' Predicate* */
        ++(*exp_idx);

        if (reparse_or_expr(ctx, exp, exp_idx)) {
            return -1;
        }

        if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_PAR2, 1)) {
            return -1;
        }
        ++(*exp_idx);
        goto predicate;
        break;
    case LYXP_TOKEN_DOT:
    case LYXP_TOKEN_DDOT:
    case LYXP_TOKEN_AT:
    case LYXP_TOKEN_NAMETEST:
    case LYXP_TOKEN_NODETYPE:
        /* RelativeLocationPath */
        if (reparse_relative_location_path(ctx, exp, exp_idx)) {
            return -1;
        }
        break;
    case LYXP_TOKEN_FUNCNAME:
        /* FunctionCall */
        if (reparse_function_call(ctx, exp, exp_idx)) {
            return -1;
        }
        goto predicate;
        break;
    case LYXP_TOKEN_OPERATOR_PATH:
        /* AbsoluteLocationPath */
        if (reparse_absolute_location_path(ctx, exp, exp_idx)) {
            return -1;
        }
        break;
    case LYXP_TOKEN_LITERAL:
        /* Literal */
        ++(*exp_idx);
        goto predicate;
        break;
    case LYXP_TOKEN_NUMBER:
        /* Number */
        ++(*exp_idx);
        goto predicate;
        break;
    default:
        LOGVAL(ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
               print_token(exp->tokens[*exp_idx]), &exp->expr[exp->expr_pos[*exp_idx]]);
        return -1;
    }

    return EXIT_SUCCESS;

predicate:
    /* Predicate* */
    while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
        if (reparse_predicate(ctx, exp, exp_idx)) {
            return -1;
        }
    }

    /* ('/' or '//') RelativeLocationPath */
    if ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH)) {

        /* '/' or '//' */
        ++(*exp_idx);

        if (reparse_relative_location_path(ctx, exp, exp_idx)) {
            return -1;
        }
    }

    return EXIT_SUCCESS;
}